

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::TestHKDF_SHA256_32
          (CryptoTest *this,string *ikm_hex,string *salt_hex,string *info_hex,string *okm_check_hex)

{
  int iVar1;
  string *psVar2;
  iterator in_R9;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  Span<const_unsigned_char> s;
  const_string msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> info;
  vector<unsigned_char,_std::allocator<unsigned_char>_> salt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> initial_key_material;
  uchar out [32];
  CHKDF_HMAC_SHA256_L32 hkdf32;
  string info_stringified;
  string salt_stringified;
  check_type cVar3;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char **local_160;
  assertion_result local_158;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  string local_d8;
  uchar local_b8 [40];
  CHKDF_HMAC_SHA256_L32 local_90;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (ikm_hex->_M_dataplus)._M_p;
  hex_str._M_len = ikm_hex->_M_string_length;
  psVar2 = okm_check_hex;
  ParseHex<unsigned_char>(&local_f0,hex_str);
  hex_str_00._M_str = (salt_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = salt_hex->_M_string_length;
  ParseHex<unsigned_char>(&local_108,hex_str_00);
  hex_str_01._M_str = (info_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = info_hex->_M_string_length;
  ParseHex<unsigned_char>(&local_120,hex_str_01);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32
            (&local_90,
             local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_50);
  CHKDF_HMAC_SHA256_L32::Expand32(&local_90,&local_70,local_b8);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x162;
  file.m_begin = (iterator)&local_130;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)psVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
  s.m_size = 0x20;
  s.m_data = local_b8;
  HexStr_abi_cxx11_(&local_d8,s);
  if (local_d8._M_string_length == okm_check_hex->_M_string_length) {
    if (local_d8._M_string_length == 0) {
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar1 = bcmp(local_d8._M_dataplus._M_p,(okm_check_hex->_M_dataplus)._M_p,
                   local_d8._M_string_length);
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar1 == 0);
    }
  }
  else {
    local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_158.m_message.px = (element_type *)0x0;
  local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160 = &local_188;
  local_188 = "HexStr(out) == okm_check_hex";
  local_180 = "";
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_190 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_158,&local_178,1,0,WARN,_cVar3,(size_t)&local_198,0x162);
  boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestHKDF_SHA256_32(const std::string &ikm_hex, const std::string &salt_hex, const std::string &info_hex, const std::string &okm_check_hex) {
    std::vector<unsigned char> initial_key_material = ParseHex(ikm_hex);
    std::vector<unsigned char> salt = ParseHex(salt_hex);
    std::vector<unsigned char> info = ParseHex(info_hex);


    // our implementation only supports strings for the "info" and "salt", stringify them
    std::string salt_stringified(reinterpret_cast<char*>(salt.data()), salt.size());
    std::string info_stringified(reinterpret_cast<char*>(info.data()), info.size());

    CHKDF_HMAC_SHA256_L32 hkdf32(initial_key_material.data(), initial_key_material.size(), salt_stringified);
    unsigned char out[32];
    hkdf32.Expand32(info_stringified, out);
    BOOST_CHECK(HexStr(out) == okm_check_hex);
}